

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns_constraints.c
# Opt level: O2

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double dVar4;
  long lVar5;
  long *plVar6;
  ulong *puVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  
  lVar5 = *(long *)((long)y->content + 0x10);
  dVar1 = *(double *)(lVar5 + 8);
  dVar2 = *(double *)(lVar5 + 0x10);
  uVar3 = *user_data;
  dVar4 = *(double *)((long)user_data + 8);
  dVar10 = *(double *)((long)user_data + 0x10);
  plVar6 = *(long **)((long)J->content + 0x20);
  puVar7 = (ulong *)*plVar6;
  *puVar7 = uVar3 ^ 0x8000000000000000;
  pdVar8 = (double *)plVar6[1];
  *pdVar8 = dVar2 * dVar4;
  pdVar9 = (double *)plVar6[2];
  *pdVar9 = dVar1 * dVar4;
  puVar7[1] = uVar3;
  dVar10 = (dVar10 + dVar10) * dVar1;
  pdVar8[1] = dVar2 * -dVar4 - dVar10;
  pdVar9[1] = -dVar4 * dVar1;
  puVar7[2] = 0;
  pdVar8[2] = dVar10;
  pdVar9[2] = 0.0;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype y2, y3;
  UserData data;
  sunrealtype p1, p2, p3;

  y2   = Ith(y, 2);
  y3   = Ith(y, 3);
  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  IJth(J, 1, 1) = -p1;
  IJth(J, 1, 2) = p2 * y3;
  IJth(J, 1, 3) = p2 * y2;
  IJth(J, 2, 1) = p1;
  IJth(J, 2, 2) = -p2 * y3 - 2 * p3 * y2;
  IJth(J, 2, 3) = -p2 * y2;
  IJth(J, 3, 1) = ZERO;
  IJth(J, 3, 2) = 2 * p3 * y2;
  IJth(J, 3, 3) = ZERO;

  return (0);
}